

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O1

bool __thiscall
HPresolve::removeColumnSingletonInDoubletonInequality(HPresolve *this,int col,int i,int k)

{
  int *piVar1;
  stack<double,_std::deque<double,_std::allocator<double>_>_> *this_00;
  stack<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::deque<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>_>
  *this_01;
  iterator *piVar2;
  double *pdVar3;
  int iVar4;
  int iVar5;
  pointer piVar6;
  pointer piVar7;
  pointer pdVar8;
  pointer pdVar9;
  double *pdVar10;
  pointer pdVar11;
  pointer pdVar12;
  pointer pdVar13;
  _Elt_pointer pcVar14;
  ulong uVar15;
  ostream *poVar16;
  long *plVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  int col_00;
  ulong uVar25;
  int iVar26;
  pair<double,_double> pVar27;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  timeval tv;
  vector<double,_std::allocator<double>_> bndsJ;
  vector<double,_std::allocator<double>_> bndsCol;
  pair<int,_std::vector<double,_std::allocator<double>_>_> local_b8;
  ulong local_98;
  pair<int,_double> local_90;
  ulong local_80;
  vector<double,_std::allocator<double>_> local_78;
  vector<double,_std::allocator<double>_> local_58;
  double local_40;
  double local_38;
  
  uVar21 = (ulong)i;
  piVar6 = (this->super_HPreData).ARstart.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar19 = (long)(this->super_HPreData).ARstart.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)piVar6 >> 2;
  uVar20 = uVar19;
  uVar24 = uVar21;
  local_98 = uVar21;
  if ((uVar21 < uVar19) && (uVar22 = (ulong)(i + 1), uVar24 = uVar22, uVar22 < uVar19)) {
    iVar4 = piVar6[uVar21];
    uVar15 = (ulong)iVar4;
    iVar5 = piVar6[uVar22];
    col_00 = -1;
    iVar26 = iVar5;
    if (iVar5 < iVar4) {
      iVar26 = iVar4;
    }
    if (iVar4 < iVar5) {
      piVar6 = (this->super_HPreData).ARindex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar18 = (long)(this->super_HPreData).ARindex.super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)piVar6 >> 2;
      piVar7 = (this->super_HPreData).flagCol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar23 = (long)(this->super_HPreData).flagCol.super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)piVar7 >> 2;
      uVar25 = uVar15;
      do {
        if (uVar18 <= uVar25) {
          uVar20 = uVar18;
          uVar24 = uVar15;
          if (uVar15 < uVar18) {
            uVar24 = uVar18;
          }
          goto LAB_001420aa;
        }
        col_00 = piVar6[uVar25];
        uVar24 = (ulong)col_00;
        uVar20 = uVar23;
        if (uVar23 <= uVar24) goto LAB_001420aa;
        if ((col_00 != col) && (piVar7[uVar24] != 0)) {
          iVar26 = (int)uVar25;
          break;
        }
        uVar20 = uVar19;
        uVar24 = uVar22;
        if (uVar19 <= uVar22) goto LAB_001420aa;
        uVar25 = uVar25 + 1;
      } while ((long)iVar26 != uVar25);
    }
    if (iVar26 == iVar5) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ERROR: nzRow[",0xd);
      uVar21 = local_98;
      poVar16 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,i);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar16,"]=2, but no second variable in row. \n",0x25);
    }
    pdVar8 = (this->super_HPreData).rowLower.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar20 = (long)(this->super_HPreData).rowLower.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)pdVar8 >> 3;
    uVar24 = uVar21;
    if (uVar21 < uVar20) {
      pdVar9 = (this->super_HPreData).rowUpper.super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar20 = (long)(this->super_HPreData).rowUpper.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pdVar9 >> 3;
      if (uVar21 < uVar20) {
        if (ABS(pdVar8[uVar21] - pdVar9[uVar21]) < this->tol) {
          uVar24 = (ulong)col_00;
          piVar6 = (this->super_HPreData).nzCol.super__Vector_base<int,_std::allocator<int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          uVar20 = (long)(this->super_HPreData).nzCol.super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_finish - (long)piVar6 >> 2;
          if (uVar20 <= uVar24) goto LAB_001420aa;
          if (1 < piVar6[uVar24]) {
            return false;
          }
        }
        gettimeofday((timeval *)&local_b8,(__timezone_ptr_t)0x0);
        (this->timer).itemStart[8] =
             (double)(long)local_b8.second.super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_start / 1000000.0 +
             (double)(long)local_b8._0_8_;
        uVar21 = (ulong)iVar26;
        pdVar8 = (this->super_HPreData).ARvalue.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar20 = (long)(this->super_HPreData).ARvalue.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pdVar8 >> 3;
        uVar24 = uVar21;
        if (uVar21 < uVar20) {
          uVar19 = (ulong)k;
          pdVar9 = (this->super_HPreData).Avalue.super__Vector_base<double,_std::allocator<double>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar20 = (long)(this->super_HPreData).Avalue.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)pdVar9 >> 3;
          uVar24 = uVar19;
          if (uVar19 < uVar20) {
            pVar27 = getNewBoundsDoubletonConstraint
                               (this,i,col_00,(int)pdVar9,pdVar8[uVar21],pdVar9[uVar19]);
            uVar22 = (ulong)col;
            pdVar8 = (this->super_HPreData).colLower.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar20 = (long)(this->super_HPreData).colLower.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish - (long)pdVar8 >> 3;
            uVar24 = uVar22;
            if (uVar22 < uVar20) {
              if (pVar27.first < pdVar8[uVar22]) {
LAB_0014178f:
                gettimeofday((timeval *)&local_b8,(__timezone_ptr_t)0x0);
                (this->timer).itemTicks[8] =
                     (((double)(long)local_b8.second.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start / 1000000.0 +
                      (double)(long)local_b8._0_8_) - (this->timer).itemStart[8]) +
                     (this->timer).itemTicks[8];
                return false;
              }
              pdVar8 = (this->super_HPreData).colUpper.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
              uVar20 = (long)(this->super_HPreData).colUpper.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish - (long)pdVar8 >> 3;
              if (uVar22 < uVar20) {
                if (pdVar8[uVar22] < pVar27.second) goto LAB_0014178f;
                pdVar8 = (this->super_HPreData).ARvalue.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
                uVar20 = (long)(this->super_HPreData).ARvalue.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_finish - (long)pdVar8 >> 3;
                uVar24 = uVar21;
                if (uVar21 < uVar20) {
                  this_00 = &(this->super_HPreData).postValue;
                  pdVar3 = pdVar8 + uVar21;
                  pdVar10 = (this->super_HPreData).postValue.c.
                            super__Deque_base<double,_std::allocator<double>_>._M_impl.
                            super__Deque_impl_data._M_finish._M_cur;
                  local_80 = uVar21;
                  if (pdVar10 ==
                      *(_Elt_pointer *)
                       ((long)&(this->super_HPreData).postValue.c.
                               super__Deque_base<double,_std::allocator<double>_>._M_impl.
                               super__Deque_impl_data._M_finish + 0x10) + -1) {
                    std::deque<double,std::allocator<double>>::_M_push_back_aux<double_const&>
                              ((deque<double,std::allocator<double>> *)this_00,pdVar3);
                  }
                  else {
                    *pdVar10 = *pdVar3;
                    (this->super_HPreData).postValue.c.
                    super__Deque_base<double,_std::allocator<double>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_cur = pdVar10 + 1;
                  }
                  pdVar8 = (this->super_HPreData).Avalue.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  uVar20 = (long)(this->super_HPreData).Avalue.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_finish - (long)pdVar8 >> 3;
                  uVar24 = uVar19;
                  if (uVar19 < uVar20) {
                    pdVar3 = pdVar8 + uVar19;
                    pdVar10 = (this->super_HPreData).postValue.c.
                              super__Deque_base<double,_std::allocator<double>_>._M_impl.
                              super__Deque_impl_data._M_finish._M_cur;
                    if (pdVar10 ==
                        *(_Elt_pointer *)
                         ((long)&(this->super_HPreData).postValue.c.
                                 super__Deque_base<double,_std::allocator<double>_>._M_impl.
                                 super__Deque_impl_data._M_finish + 0x10) + -1) {
                      std::deque<double,std::allocator<double>>::_M_push_back_aux<double_const&>
                                ((deque<double,std::allocator<double>> *)this_00,pdVar3);
                    }
                    else {
                      *pdVar10 = *pdVar3;
                      (this->super_HPreData).postValue.c.
                      super__Deque_base<double,_std::allocator<double>_>._M_impl.
                      super__Deque_impl_data._M_finish._M_cur = pdVar10 + 1;
                    }
                    pdVar8 = (this->super_HPreData).Avalue.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start;
                    uVar20 = (long)(this->super_HPreData).Avalue.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_finish - (long)pdVar8 >> 3;
                    if (uVar19 < uVar20) {
                      pdVar9 = (this->super_HPreData).ARvalue.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start;
                      uVar20 = (long)(this->super_HPreData).ARvalue.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_finish - (long)pdVar9 >> 3;
                      uVar24 = local_80;
                      if (local_80 < uVar20) {
                        pVar27 = getNewBoundsDoubletonConstraint
                                           (this,i,col,(int)pdVar9,pdVar8[uVar19],pdVar9[local_80]);
                        local_40 = pVar27.second;
                        local_38 = pVar27.first;
                        if (this->iKKTcheck == 1) {
                          local_b8._0_8_ = (pointer)0x0;
                          local_b8.second.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                          local_b8.second.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                          local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                          local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start = (pointer)0x0;
                          local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish = (pointer)0x0;
                          local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                          local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start = (pointer)0x0;
                          local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish = (pointer)0x0;
                          uVar21 = (ulong)col_00;
                          pdVar8 = (this->super_HPreData).colLower.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_start;
                          if ((ulong)((long)(this->super_HPreData).colLower.
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data._M_finish - (long)pdVar8
                                     >> 3) <= uVar21) {
                            std::__throw_out_of_range_fmt
                                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                       ,uVar21);
                          }
                          local_90.second = pdVar8[uVar21];
                          local_90.first = col_00;
                          std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>::
                          _M_realloc_insert<std::pair<int,double>>
                                    ((vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>
                                      *)&local_b8,(iterator)0x0,&local_90);
                          pdVar8 = (this->super_HPreData).colUpper.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_start;
                          if ((ulong)((long)(this->super_HPreData).colUpper.
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data._M_finish - (long)pdVar8
                                     >> 3) <= uVar21) {
                            std::__throw_out_of_range_fmt
                                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                       ,uVar21);
                          }
                          local_90.second = pdVar8[uVar21];
                          if (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish ==
                              local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage) {
                            local_90.first = col_00;
                            std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>
                            ::_M_realloc_insert<std::pair<int,double>>
                                      ((vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>
                                        *)&local_58,
                                       (iterator)
                                       local_58.super__Vector_base<double,_std::allocator<double>_>.
                                       _M_impl.super__Vector_impl_data._M_finish,&local_90);
                          }
                          else {
                            local_90.second._4_4_ = (undefined4)((ulong)local_90.second >> 0x20);
                            *(int *)local_58.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_finish = col_00;
                            *(undefined4 *)
                             ((long)local_58.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_finish + 4) = local_90._4_4_;
                            *(undefined4 *)
                             ((long)local_58.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_finish + 8) =
                                 local_90.second._0_4_;
                            *(undefined4 *)
                             ((long)((long)local_58.
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_finish + 8) + 4) =
                                 local_90.second._4_4_;
                            local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish =
                                 (pointer)((long)local_58.
                                                 super__Vector_base<double,_std::allocator<double>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish + 0x10);
                            local_90.first = col_00;
                          }
                          pdVar8 = (this->super_HPreData).colCost.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_start;
                          if ((ulong)((long)(this->super_HPreData).colCost.
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data._M_finish - (long)pdVar8
                                     >> 3) <= uVar21) {
                            std::__throw_out_of_range_fmt
                                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                       ,uVar21);
                          }
                          local_90.second = pdVar8[uVar21];
                          if (local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish ==
                              local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage) {
                            local_90.first = col_00;
                            std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>
                            ::_M_realloc_insert<std::pair<int,double>>
                                      ((vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>
                                        *)&local_78,
                                       (iterator)
                                       local_78.super__Vector_base<double,_std::allocator<double>_>.
                                       _M_impl.super__Vector_impl_data._M_finish,&local_90);
                          }
                          else {
                            *local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish =
                                 (double)CONCAT44(local_90._4_4_,col_00);
                            *(double *)
                             ((long)local_78.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_finish + 8) = local_90.second
                            ;
                            local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish =
                                 (pointer)((long)local_78.
                                                 super__Vector_base<double,_std::allocator<double>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish + 0x10);
                            local_90.first = col_00;
                          }
                          std::
                          deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                          ::push_back(&(this->super_HPreData).chk.cLowers.c,(value_type *)&local_b8)
                          ;
                          std::
                          deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                          ::push_back(&(this->super_HPreData).chk.cUppers.c,(value_type *)&local_58)
                          ;
                          std::
                          deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                          ::push_back(&(this->super_HPreData).chk.costs.c,(value_type *)&local_78);
                          if ((pair<int,_double> *)
                              local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start != (pair<int,_double> *)0x0) {
                            operator_delete(local_78.
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data._M_start);
                          }
                          if (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start != (pointer)0x0) {
                            operator_delete(local_58.
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data._M_start);
                          }
                          if ((pointer)local_b8._0_8_ != (pointer)0x0) {
                            operator_delete((void *)local_b8._0_8_);
                          }
                        }
                        pdVar8 = (this->super_HPreData).colLower.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start;
                        uVar20 = (long)(this->super_HPreData).colLower.
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data._M_finish - (long)pdVar8 >> 3;
                        uVar24 = uVar22;
                        if (uVar22 < uVar20) {
                          local_b8._0_8_ = pdVar8[uVar22];
                          pdVar8 = (this->super_HPreData).colUpper.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_start;
                          uVar20 = (long)(this->super_HPreData).colUpper.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_finish - (long)pdVar8 >> 3;
                          if (uVar22 < uVar20) {
                            local_b8.second.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start = (pointer)pdVar8[uVar22];
                            pdVar8 = (this->super_HPreData).colCost.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start;
                            uVar20 = (long)(this->super_HPreData).colCost.
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_finish - (long)pdVar8
                                     >> 3;
                            if (uVar22 < uVar20) {
                              local_b8.second.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_finish = (pointer)pdVar8[uVar22];
                              __l._M_len = 3;
                              __l._M_array = (iterator)&local_b8;
                              std::vector<double,_std::allocator<double>_>::vector
                                        (&local_58,__l,(allocator_type *)&local_78);
                              uVar21 = (ulong)col_00;
                              pdVar8 = (this->super_HPreData).colLower.
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data._M_start;
                              if (uVar21 < (ulong)((long)(this->super_HPreData).colLower.
                                                                                                                  
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)pdVar8 >> 3)) {
                                local_b8._0_8_ = pdVar8[uVar21];
                                pdVar8 = (this->super_HPreData).colUpper.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_start;
                                if (uVar21 < (ulong)((long)(this->super_HPreData).colUpper.
                                                                                                                      
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)pdVar8 >> 3)) {
                                  local_b8.second.
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_start = (pointer)pdVar8[uVar21];
                                  pdVar8 = (this->super_HPreData).colCost.
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_start;
                                  if (uVar21 < (ulong)((long)(this->super_HPreData).colCost.
                                                                                                                          
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)pdVar8 >> 3)) {
                                    local_b8.second.
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_finish = (pointer)pdVar8[uVar21];
                                    __l_00._M_len = 3;
                                    __l_00._M_array = (iterator)&local_b8;
                                    std::vector<double,_std::allocator<double>_>::vector
                                              (&local_78,__l_00,(allocator_type *)&local_90);
                                    local_b8.first = col;
                                    std::vector<double,_std::allocator<double>_>::vector
                                              (&local_b8.second,&local_58);
                                    this_01 = &(this->super_HPreData).oldBounds;
                                    std::
                                    deque<std::pair<int,std::vector<double,std::allocator<double>>>,std::allocator<std::pair<int,std::vector<double,std::allocator<double>>>>>
                                    ::
                                    emplace_back<std::pair<int,std::vector<double,std::allocator<double>>>>
                                              ((deque<std::pair<int,std::vector<double,std::allocator<double>>>,std::allocator<std::pair<int,std::vector<double,std::allocator<double>>>>>
                                                *)this_01,&local_b8);
                                    if ((pointer)local_b8.second.
                                                 super__Vector_base<double,_std::allocator<double>_>
                                                 ._M_impl.super__Vector_impl_data._M_start !=
                                        (pointer)0x0) {
                                      operator_delete(local_b8.second.
                                                                                                            
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                    }
                                    local_b8.first = col_00;
                                    std::vector<double,_std::allocator<double>_>::vector
                                              (&local_b8.second,&local_78);
                                    std::
                                    deque<std::pair<int,std::vector<double,std::allocator<double>>>,std::allocator<std::pair<int,std::vector<double,std::allocator<double>>>>>
                                    ::
                                    emplace_back<std::pair<int,std::vector<double,std::allocator<double>>>>
                                              ((deque<std::pair<int,std::vector<double,std::allocator<double>>>,std::allocator<std::pair<int,std::vector<double,std::allocator<double>>>>>
                                                *)this_01,&local_b8);
                                    if ((pointer)local_b8.second.
                                                 super__Vector_base<double,_std::allocator<double>_>
                                                 ._M_impl.super__Vector_impl_data._M_start !=
                                        (pointer)0x0) {
                                      operator_delete(local_b8.second.
                                                                                                            
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                    }
                                    pdVar8 = (this->super_HPreData).colLower.
                                             super__Vector_base<double,_std::allocator<double>_>.
                                             _M_impl.super__Vector_impl_data._M_start;
                                    uVar20 = uVar21;
                                    if (uVar21 < (ulong)((long)(this->super_HPreData).colLower.
                                                                                                                              
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)pdVar8 >> 3)) {
                                      if (pdVar8[uVar21] <= local_38 && local_38 != pdVar8[uVar21])
                                      {
                                        pdVar8[uVar21] = local_38;
                                      }
                                      pdVar9 = (this->super_HPreData).colUpper.
                                               super__Vector_base<double,_std::allocator<double>_>.
                                               _M_impl.super__Vector_impl_data._M_start;
                                      if (uVar21 < (ulong)((long)(this->super_HPreData).colUpper.
                                                                                                                                  
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)pdVar9 >> 3)) {
                                        if (local_40 < pdVar9[uVar21]) {
                                          pdVar9[uVar21] = local_40;
                                        }
                                        pdVar11 = (this->super_HPreData).colCost.
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                        uVar24 = (long)(this->super_HPreData).colCost.
                                                                                                              
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                 (long)pdVar11 >> 3;
                                        if ((((uVar21 < uVar24) &&
                                             (uVar20 = uVar22, uVar22 < uVar24)) &&
                                            (pdVar12 = (this->super_HPreData).ARvalue.
                                                                                                              
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                            uVar20 = local_80,
                                            local_80 <
                                            (ulong)((long)(this->super_HPreData).ARvalue.
                                                                                                                    
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)pdVar12 >> 3))) &&
                                           (pdVar13 = (this->super_HPreData).Avalue.
                                                                                                            
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                           uVar20 = uVar19,
                                           uVar19 < (ulong)((long)(this->super_HPreData).Avalue.
                                                                                                                                    
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)pdVar13 >> 3))) {
                                          pdVar11[uVar21] =
                                               pdVar11[uVar21] -
                                               (pdVar11[uVar22] * pdVar12[local_80]) /
                                               pdVar13[uVar19];
                                          if (local_78.
                                              super__Vector_base<double,_std::allocator<double>_>.
                                              _M_impl.super__Vector_impl_data._M_finish ==
                                              local_78.
                                              super__Vector_base<double,_std::allocator<double>_>.
                                              _M_impl.super__Vector_impl_data._M_start) {
                                            uVar20 = 0;
                                          }
                                          else {
                                            *local_78.
                                             super__Vector_base<double,_std::allocator<double>_>.
                                             _M_impl.super__Vector_impl_data._M_start =
                                                 pdVar8[uVar21];
                                            if ((ulong)((long)local_78.
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)local_78.
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 3) <
                                                2) {
                                              uVar20 = 1;
                                            }
                                            else {
                                              *(double *)
                                               ((long)local_78.
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + 8) =
                                                   pdVar9[uVar21];
                                              if ((long)local_78.
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)local_78.
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start == 0x10)
                                              {
                                                uVar20 = 2;
                                              }
                                              else {
                                                *(double *)
                                                 ((long)local_78.
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + 0x10)
                                                     = pdVar11[uVar21];
                                                std::vector<double,_std::allocator<double>_>::vector
                                                          (&local_b8.second,&local_78);
                                                std::
                                                deque<std::pair<int,std::vector<double,std::allocator<double>>>,std::allocator<std::pair<int,std::vector<double,std::allocator<double>>>>>
                                                ::
                                                emplace_back<std::pair<int,std::vector<double,std::allocator<double>>>>
                                                          ((
                                                  deque<std::pair<int,std::vector<double,std::allocator<double>>>,std::allocator<std::pair<int,std::vector<double,std::allocator<double>>>>>
                                                  *)this_01,&local_b8);
                                                if ((pointer)local_b8.second.
                                                                                                                          
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                  operator_delete(local_b8.second.
                                                                                                                                    
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                }
                                                if (0 < this->iPrint) {
                                                  std::__ostream_insert<char,std::char_traits<char>>
                                                            ((ostream *)&std::cout,
                                                             "PR: Column singleton ",0x15);
                                                  poVar16 = (ostream *)
                                                            std::ostream::operator<<
                                                                      ((ostream *)&std::cout,col);
                                                  std::__ostream_insert<char,std::char_traits<char>>
                                                            (poVar16,
                                                  " in a doubleton inequality constraint removed. Row "
                                                  ,0x33);
                                                  poVar16 = (ostream *)
                                                            std::ostream::operator<<(poVar16,i);
                                                  std::__ostream_insert<char,std::char_traits<char>>
                                                            (poVar16," removed. variable left is ",
                                                             0x1b);
                                                  plVar17 = (long *)std::ostream::operator<<
                                                                              (poVar16,col_00);
                                                  std::ios::widen((char)*(undefined8 *)
                                                                         (*plVar17 + -0x18) +
                                                                  (char)plVar17);
                                                  std::ostream::put((char)plVar17);
                                                  std::ostream::flush();
                                                }
                                                piVar6 = (this->super_HPreData).flagCol.
                                                                                                                  
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start;
                                                uVar20 = uVar22;
                                                if (uVar22 < (ulong)((long)(this->super_HPreData).
                                                                           flagCol.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                                  (long)piVar6 >> 2)) {
                                                  piVar6[uVar22] = 0;
                                                  fillStackRowBounds(this,i);
                                                  piVar1 = (this->countRemovedCols).
                                                                                                                      
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start + 8;
                                                  *piVar1 = *piVar1 + 1;
                                                  piVar1 = (this->countRemovedRows).
                                                                                                                      
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start + 8;
                                                  *piVar1 = *piVar1 + 1;
                                                  pdVar8 = (this->super_HPreData).valueColDual.
                                                                                                                      
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  if (uVar22 < (ulong)((long)(this->super_HPreData).
                                                                             valueColDual.
                                                                                                                                                          
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)pdVar8 >> 3)) {
                                                    pdVar8[uVar22] = 0.0;
                                                    pdVar8 = (this->super_HPreData).colCost.
                                                                                                                          
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  if (((uVar22 < (ulong)((long)(this->super_HPreData
                                                                               ).colCost.
                                                                                                                                                              
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)pdVar8 >> 3)) &&
                                                  (pdVar9 = (this->super_HPreData).Avalue.
                                                                                                                        
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  uVar20 = uVar19,
                                                  uVar19 < (ulong)((long)(this->super_HPreData).
                                                                         Avalue.
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)pdVar9 >> 3))) &&
                                                  (pdVar11 = (this->super_HPreData).valueRowDual.
                                                                                                                          
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  uVar20 = local_98,
                                                  local_98 <
                                                  (ulong)((long)(this->super_HPreData).valueRowDual.
                                                                                                                                
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)pdVar11 >> 3))) {
                                                    pdVar11[local_98] =
                                                         -pdVar8[uVar22] / pdVar9[uVar19];
                                                    local_b8._4_4_ = i;
                                                    local_b8.first = 8;
                                                    local_b8.second.
                                                                                                        
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)CONCAT44(local_b8.second.
                                                                                                                                                  
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  col);
                                                  pcVar14 = (this->super_HPreData).chng.c.
                                                                                                                        
                                                  super__Deque_base<change,_std::allocator<change>_>
                                                  ._M_impl.super__Deque_impl_data._M_finish._M_cur;
                                                  if (pcVar14 ==
                                                      *(_Elt_pointer *)
                                                       ((long)&(this->super_HPreData).chng.c.
                                                                                                                              
                                                  super__Deque_base<change,_std::allocator<change>_>
                                                  ._M_impl.super__Deque_impl_data._M_finish + 0x10)
                                                  + -1) {
                                                    std::deque<change,std::allocator<change>>::
                                                    _M_push_back_aux<change_const&>
                                                              ((deque<change,std::allocator<change>>
                                                                *)&(this->super_HPreData).chng,
                                                               (change *)&local_b8);
                                                  }
                                                  else {
                                                    pcVar14->col = col;
                                                    pcVar14->type = 8;
                                                    pcVar14->row = i;
                                                    piVar2 = &(this->super_HPreData).chng.c.
                                                                                                                            
                                                  super__Deque_base<change,_std::allocator<change>_>
                                                  ._M_impl.super__Deque_impl_data._M_finish;
                                                  piVar2->_M_cur = piVar2->_M_cur + 1;
                                                  }
                                                  piVar6 = (this->super_HPreData).nzCol.
                                                                                                                      
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start;
                                                  uVar20 = uVar21;
                                                  if (uVar21 < (ulong)((long)(this->super_HPreData).
                                                                             nzCol.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                                  (long)piVar6 >> 2)) {
                                                    iVar4 = piVar6[uVar21];
                                                    if (iVar4 < 2) {
                                                      if (iVar4 == 1) {
                                                        removeSecondColumnSingletonInDoubletonRow
                                                                  (this,col_00,i);
                                                      }
                                                    }
                                                    else {
                                                      removeRow(this,i);
                                                    }
                                                    gettimeofday((timeval *)&local_b8,
                                                                 (__timezone_ptr_t)0x0);
                                                    (this->timer).itemTicks[8] =
                                                         (((double)(long)local_b8.second.
                                                                                                                                                  
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start /
                                                  1000000.0 + (double)(long)local_b8._0_8_) -
                                                  (this->timer).itemStart[8]) +
                                                  (this->timer).itemTicks[8];
                                                  if ((pair<int,_double> *)
                                                      local_78.
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pair<int,_double> *)0x0) {
                                                    operator_delete(local_78.
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  if (local_58.
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_58.
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  return true;
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                    std::__throw_out_of_range_fmt
                                              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                               ,uVar20);
                                  }
                                }
                              }
                              std::__throw_out_of_range_fmt
                                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                         ,uVar21);
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_001420aa:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar24,
             uVar20);
}

Assistant:

bool HPresolve::removeColumnSingletonInDoubletonInequality(const int col, const int i, const int k) {
	//second column index j
	//second column row array index kk
	int j = -1;

	//count
	int kk = ARstart.at(i);
	while (kk<ARstart.at(i+1)) {
		j = ARindex.at(kk);
		if (flagCol.at(j) && j!=col)
			break;
		else
			++kk;
	}
	if (kk==ARstart.at(i+1))
		cout<<"ERROR: nzRow["<< i<< "]=2, but no second variable in row. \n";

	//only inequality case and case two singletons here,
	//others handled in doubleton equation
	if ((abs(rowLower.at(i) - rowUpper.at(i)) < tol) && (nzCol.at(j) > 1))
		return false;

	timer.recordStart(SING_COL_DOUBLETON_INEQ);
	// additional check if it is indeed implied free
	// needed since we handle inequalities and it may not be true
	// low and upp to be tighter than original bounds for variable col
	// so it is indeed implied free and we can remove it
	pair<double, double> p = getNewBoundsDoubletonConstraint(i, j, col, ARvalue.at(kk), Avalue.at(k));
	if (!(colLower.at(col) <= p.first && colUpper.at(col) >= p.second)) {
		timer.recordFinish(SING_COL_DOUBLETON_INEQ);
		return false;
	}

	postValue.push(ARvalue.at(kk));
	postValue.push(Avalue.at(k));

	//modify bounds on variable j, variable col (k) is substituted out
	//double aik = Avalue.at(k);
	//double aij = Avalue.at(kk);
	p = getNewBoundsDoubletonConstraint(i, col, j, Avalue.at(k), ARvalue.at(kk));
	double low = p.first;
	double upp = p.second;

	//add old bounds of xj to checker and for postsolve
	if (iKKTcheck == 1) {
		vector<pair<int, double> > bndsL, bndsU, costS;
		bndsL.push_back( make_pair( j, colLower.at(j)));
		bndsU.push_back( make_pair( j, colUpper.at(j)));
		costS.push_back( make_pair( j, colCost.at(j)));
		chk.cLowers.push(bndsL);
		chk.cUppers.push(bndsU);
		chk.costs.push(costS);
	}

	vector<double> bndsCol({colLower.at(col), colUpper.at(col), colCost.at(col)});
	vector<double> bndsJ({colLower.at(j), colUpper.at(j), colCost.at(j)});
	oldBounds.push(make_pair( col, bndsCol));
	oldBounds.push(make_pair( j, bndsJ));

	//modify bounds of xj
	if (low > colLower.at(j))
		colLower.at(j) = low;
	if (upp < colUpper.at(j))
		colUpper.at(j) = upp;

	//modify cost of xj
	colCost.at(j) = colCost.at(j) - colCost.at(col)*ARvalue.at(kk)/Avalue.at(k);

	//for postsolve: need the new bounds too
	//oldBounds.push_back(colLower.at(j)); oldBounds.push_back(colUpper.at(j));
	bndsJ.at(0) = (colLower.at(j));
	bndsJ.at(1) = (colUpper.at(j));
	bndsJ.at(2) = (colCost.at(j));
	oldBounds.push(make_pair( j, bndsJ));

	//remove col as free column singleton
	if (iPrint > 0)
		cout<<"PR: Column singleton "<<col<<" in a doubleton inequality constraint removed. Row "<<i<<" removed. variable left is "<<j<<endl;

	flagCol.at(col) = 0;
	fillStackRowBounds(i);
	countRemovedCols[SING_COL_DOUBLETON_INEQ]++;
	countRemovedRows[SING_COL_DOUBLETON_INEQ]++;

	valueColDual.at(col) = 0;
	valueRowDual.at(i) = -colCost.at(col)/Avalue.at(k); //may be changed later, depending on bounds.
	addChange(SING_COL_DOUBLETON_INEQ, i, col);

	//if not special case two column singletons
	if (nzCol.at(j) > 1)
		removeRow(i);
	else if (nzCol.at(j)==1)
		removeSecondColumnSingletonInDoubletonRow(j, i);

	timer.recordFinish(SING_COL_DOUBLETON_INEQ);
	return true;
}